

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcorolib.c
# Opt level: O2

int luaB_auxwrap(lua_State *L)

{
  int iVar1;
  uint uVar2;
  lua_State *co;
  
  co = lua_tothread(L,-0xf4629);
  iVar1 = lua_gettop(L);
  iVar1 = auxresume(L,co,iVar1);
  if (-1 < iVar1) {
    return iVar1;
  }
  uVar2 = lua_status(co);
  if (1 < uVar2) {
    iVar1 = lua_closethread(co,L);
    lua_xmove(co,L,1);
    if (iVar1 == 4) goto LAB_00130e52;
  }
  iVar1 = lua_type(L,-1);
  if (iVar1 == 4) {
    luaL_where(L,1);
    lua_rotate(L,-2,1);
    lua_concat(L,2);
  }
LAB_00130e52:
  iVar1 = lua_error(L);
  return iVar1;
}

Assistant:

static int luaB_auxwrap (lua_State *L) {
  lua_State *co = lua_tothread(L, lua_upvalueindex(1));
  int r = auxresume(L, co, lua_gettop(L));
  if (l_unlikely(r < 0)) {  /* error? */
    int stat = lua_status(co);
    if (stat != LUA_OK && stat != LUA_YIELD) {  /* error in the coroutine? */
      stat = lua_closethread(co, L);  /* close its tbc variables */
      lua_assert(stat != LUA_OK);
      lua_xmove(co, L, 1);  /* move error message to the caller */
    }
    if (stat != LUA_ERRMEM &&  /* not a memory error and ... */
        lua_type(L, -1) == LUA_TSTRING) {  /* ... error object is a string? */
      luaL_where(L, 1);  /* add extra info, if available */
      lua_insert(L, -2);
      lua_concat(L, 2);
    }
    return lua_error(L);  /* propagate error */
  }
  return r;
}